

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

int32_t decShiftToLeast(uint8_t *uar,int32_t units,int32_t shift)

{
  int iVar1;
  int iVar2;
  uint local_64;
  uint local_54;
  uint local_48;
  uint local_3c;
  int32_t rem;
  int32_t quot;
  int32_t count;
  int32_t cut;
  uint8_t *up;
  uint8_t *target;
  int32_t shift_local;
  int32_t units_local;
  uint8_t *uar_local;
  
  uar_local._4_4_ = units;
  if (shift != 0) {
    if (shift == units) {
      *uar = '\0';
      uar_local._4_4_ = 1;
    }
    else {
      if (shift < 0x32) {
        local_48 = (uint)""[shift];
      }
      else {
        local_48 = shift / 1;
      }
      iVar1 = shift - (local_48 - 1);
      up = uar;
      if (iVar1 == 1) {
        if (shift < 0x32) {
          local_54 = (uint)""[shift];
        }
        else {
          local_54 = shift / 1;
        }
        for (_count = uar + (int)local_54; _count < uar + units; _count = _count + 1) {
          *up = *_count;
          up = up + 1;
        }
        uar_local._4_4_ = (int)up - (int)uar;
      }
      else {
        if (shift - iVar1 < 0x32) {
          local_64 = (uint)""[shift - iVar1];
        }
        else {
          local_64 = (shift - iVar1) / 1;
        }
        _count = uar + (int)local_64;
        rem = units - shift;
        local_3c = (uint)(*_count >> ((byte)iVar1 & 0x1f)) * multies[iVar1] >> 0x11;
        while( true ) {
          *up = (uint8_t)local_3c;
          iVar2 = rem - (1 - iVar1);
          if (iVar2 < 1) break;
          _count = _count + 1;
          local_3c = (uint)(*_count >> ((byte)iVar1 & 0x1f)) * multies[iVar1] >> 0x11;
          *up = *up + (*_count - (char)local_3c * (char)DECPOWERS[iVar1]) *
                      (char)DECPOWERS[1 - iVar1];
          rem = iVar2 - iVar1;
          if (rem < 1) break;
          up = up + 1;
        }
        uar_local._4_4_ = ((int)up - (int)uar) + 1;
      }
    }
  }
  return uar_local._4_4_;
}

Assistant:

static Int decShiftToLeast(Unit *uar, Int units, Int shift) {
  Unit  *target, *up;              /* work  */
  Int   cut, count;                /* work  */
  Int   quot, rem;                 /* for division  */

  if (shift==0) return units;      /* [fastpath] nothing to do  */
  if (shift==units*DECDPUN) {      /* [fastpath] little to do  */
    *uar=0;                        /* all digits cleared gives zero  */
    return 1;                      /* leaves just the one  */
    }

  target=uar;                      /* both paths  */
  cut=MSUDIGITS(shift);
  if (cut==DECDPUN) {              /* unit-boundary case; easy  */
    up=uar+D2U(shift);
    for (; up<uar+units; target++, up++) *target=*up;
    return static_cast<int32_t>(target-uar);
    }

  /* messier  */
  up=uar+D2U(shift-cut);           /* source; correct to whole Units  */
  count=units*DECDPUN-shift;       /* the maximum new length  */
  #if DECDPUN<=4
    quot=QUOT10(*up, cut);
  #else
    quot=*up/powers[cut];
  #endif
  for (; ; target++) {
    *target=(Unit)quot;
    count-=(DECDPUN-cut);
    if (count<=0) break;
    up++;
    quot=*up;
    #if DECDPUN<=4
      quot=QUOT10(quot, cut);
      rem=*up-quot*powers[cut];
    #else
      rem=quot%powers[cut];
      quot=quot/powers[cut];
    #endif
    *target=(Unit)(*target+rem*powers[DECDPUN-cut]);
    count-=cut;
    if (count<=0) break;
    }
  return static_cast<int32_t>(target-uar+1);
  }